

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

void __thiscall MIDISong2::ProcessInitialMetaEvents(MIDISong2 *this)

{
  TrackInfo *this_00;
  BYTE BVar1;
  BYTE *pBVar2;
  size_t sVar3;
  DWORD DVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  
  for (lVar7 = 0; lVar7 < this->NumTracks; lVar7 = lVar7 + 1) {
    this_00 = this->Tracks + lVar7;
    uVar6 = this->Tracks[lVar7].TrackP;
    while ((((uVar5 = this_00->MaxTrackP - 4, this_00->Finished == false && (uVar6 < uVar5)) &&
            (pBVar2 = this_00->TrackBegin, pBVar2[uVar6] == '\0')) && (pBVar2[uVar6 + 1] == 0xff)))
    {
      BVar1 = pBVar2[uVar6 + 2];
      this_00->TrackP = uVar6 + 3;
      DVar4 = TrackInfo::ReadVarLen(this_00);
      sVar3 = this_00->TrackP;
      uVar6 = sVar3 + DVar4;
      if (uVar6 <= this_00->MaxTrackP) {
        if (BVar1 == 'Q') {
          pBVar2 = this_00->TrackBegin;
          MIDIStreamer::SetTempo
                    (&this->super_MIDIStreamer,
                     (uint)pBVar2[sVar3 + 2] |
                     (uint)pBVar2[sVar3 + 1] << 8 | (uint)pBVar2[sVar3] << 0x10);
          uVar6 = (ulong)DVar4 + this_00->TrackP;
        }
        else if (BVar1 == '/') {
          this_00->Finished = true;
        }
      }
      this_00->TrackP = uVar6;
    }
    if (uVar5 <= uVar6) {
      this_00->Finished = true;
    }
  }
  return;
}

Assistant:

void MIDISong2::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = track->ReadVarLen ();
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}